

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
RehashGenericCommand::trigger(RehashGenericCommand *this,string_view parameters)

{
  long lVar1;
  ResponseLine *pRVar2;
  undefined8 uVar3;
  string *__return_storage_ptr__;
  string sStack_58;
  string local_38;
  
  __return_storage_ptr__ = &sStack_58;
  lVar1 = Jupiter::rehash();
  pRVar2 = (ResponseLine *)operator_new(0x30);
  if (lVar1 == 0) {
    uVar3 = Jupiter::getRehashableCount();
    __return_storage_ptr__ = &local_38;
    string_printf_abi_cxx11_
              (__return_storage_ptr__,"All %u objects were successfully rehashed.",uVar3);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,__return_storage_ptr__,0);
  }
  else {
    uVar3 = Jupiter::getRehashableCount();
    string_printf_abi_cxx11_
              (&sStack_58,"%u of %u objects failed to successfully rehash.",lVar1,uVar3);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,&sStack_58,2);
  }
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return pRVar2;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *RehashGenericCommand::trigger(std::string_view parameters) {
	size_t hash_errors = Jupiter::rehash();

	if (hash_errors == 0)
		return new Jupiter::GenericCommand::ResponseLine(string_printf("All %u objects were successfully rehashed.", Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicSuccess);

	return new Jupiter::GenericCommand::ResponseLine(string_printf("%u of %u objects failed to successfully rehash.", hash_errors, Jupiter::getRehashableCount()), GenericCommand::DisplayType::PublicError);
}